

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O3

istream * anon_unknown.dwarf_25f6c::operator>>(istream *in,RGB *rgb)

{
  undefined8 in_RAX;
  void *pvVar1;
  undefined8 uStack_38;
  short r;
  short g;
  short b;
  
  uStack_38 = in_RAX;
  pvVar1 = (void *)std::istream::operator>>(in,(short *)((long)&uStack_38 + 2));
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(short *)((long)&uStack_38 + 4));
  std::istream::operator>>(pvVar1,(short *)((long)&uStack_38 + 6));
  rgb->r = uStack_38._2_1_;
  rgb->g = uStack_38._4_1_;
  rgb->b = uStack_38._6_1_;
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, RGB& rgb)
{
  short r, g, b;
  in >> r >> g >> b;
  rgb.r = r;
  rgb.g = g;
  rgb.b = b;
  return in;
}